

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

void __thiscall
kj::ArrayBuilder<capnp::Orphan<capnp::compiler::Expression>_>::dispose
          (ArrayBuilder<capnp::Orphan<capnp::compiler::Expression>_> *this)

{
  Orphan<capnp::compiler::Expression> *pOVar1;
  RemoveConst<capnp::Orphan<capnp::compiler::Expression>_> *pRVar2;
  Orphan<capnp::compiler::Expression> *pOVar3;
  
  pOVar1 = this->ptr;
  if (pOVar1 != (Orphan<capnp::compiler::Expression> *)0x0) {
    pRVar2 = this->pos;
    pOVar3 = this->endPtr;
    this->endPtr = (Orphan<capnp::compiler::Expression> *)0x0;
    this->ptr = (Orphan<capnp::compiler::Expression> *)0x0;
    this->pos = (RemoveConst<capnp::Orphan<capnp::compiler::Expression>_> *)0x0;
    (*(code *)**(undefined8 **)this->disposer)
              (this->disposer,pOVar1,0x20,(long)pRVar2 - (long)pOVar1 >> 5,
               (long)pOVar3 - (long)pOVar1 >> 5,
               ArrayDisposer::Dispose_<capnp::Orphan<capnp::compiler::Expression>_>::destruct);
    return;
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    T* posCopy = pos;
    T* endCopy = endPtr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      pos = nullptr;
      endPtr = nullptr;
      disposer->dispose(ptrCopy, posCopy - ptrCopy, endCopy - ptrCopy);
    }
  }